

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

QModelIndexList * __thiscall
QAbstractItemViewPrivate::selectedDraggableIndexes
          (QModelIndexList *__return_storage_ptr__,QAbstractItemViewPrivate *this)

{
  long *plVar1;
  quintptr qVar2;
  int iVar3;
  ulong uVar4;
  iterator aend;
  iterator iVar5;
  long lVar6;
  long lVar7;
  QModelIndex *pQVar9;
  long lVar10;
  const_iterator abegin;
  QModelIndex *pQVar11;
  QModelIndex *pQVar8;
  
  plVar1 = *(long **)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                      super_QWidgetPrivate.field_0x8;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined4 *)&(__return_storage_ptr__->d).d = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = 0xaaaaaaaa;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = 0xaaaaaaaa;
  (**(code **)(*plVar1 + 0x2d8))();
  pQVar9 = (__return_storage_ptr__->d).ptr;
  lVar7 = (__return_storage_ptr__->d).size;
  lVar6 = lVar7;
  pQVar11 = pQVar9;
  if (0 < lVar7 >> 2) {
    lVar10 = (lVar7 >> 2) + 1;
    lVar6 = lVar7 * 0x18;
    do {
      uVar4 = (**(code **)(*(long *)this->model + 0x138))(this->model,pQVar11);
      pQVar8 = pQVar11;
      if ((uVar4 & 4) == 0) goto LAB_0053335c;
      uVar4 = (**(code **)(*(long *)this->model + 0x138))(this->model,pQVar11 + 1);
      pQVar8 = pQVar11 + 1;
      if ((uVar4 & 4) == 0) goto LAB_0053335c;
      uVar4 = (**(code **)(*(long *)this->model + 0x138))(this->model,pQVar11 + 2);
      pQVar8 = pQVar11 + 2;
      if ((uVar4 & 4) == 0) goto LAB_0053335c;
      uVar4 = (**(code **)(*(long *)this->model + 0x138))(this->model,pQVar11 + 3);
      pQVar8 = pQVar11 + 3;
      if ((uVar4 & 4) == 0) goto LAB_0053335c;
      pQVar11 = pQVar11 + 4;
      lVar10 = lVar10 + -1;
      lVar6 = lVar6 + -0x60;
    } while (1 < lVar10);
    lVar6 = (lVar6 >> 3) * -0x5555555555555555;
  }
  if (lVar6 != 1) {
    pQVar8 = pQVar11;
    if (lVar6 != 2) {
      pQVar8 = pQVar9 + lVar7;
      if ((lVar6 != 3) ||
         (uVar4 = (**(code **)(*(long *)this->model + 0x138))(this->model,pQVar11), pQVar8 = pQVar11
         , (uVar4 & 4) == 0)) goto LAB_0053335c;
      pQVar8 = pQVar11 + 1;
    }
    uVar4 = (**(code **)(*(long *)this->model + 0x138))(this->model,pQVar8);
    if ((uVar4 & 4) == 0) goto LAB_0053335c;
    pQVar11 = pQVar8 + 1;
  }
  uVar4 = (**(code **)(*(long *)this->model + 0x138))(this->model,pQVar11);
  pQVar8 = pQVar9 + lVar7;
  if ((uVar4 & 4) == 0) {
    pQVar8 = pQVar11;
  }
LAB_0053335c:
  lVar7 = (long)pQVar8 - (long)pQVar9;
  if ((lVar7 >> 3) * -0x5555555555555555 - (__return_storage_ptr__->d).size != 0) {
    aend = QList<QModelIndex>::end(__return_storage_ptr__);
    iVar5 = QList<QModelIndex>::begin(__return_storage_ptr__);
    abegin.i = iVar5.i + lVar7;
    pQVar9 = lVar7 + iVar5.i;
    while (pQVar11 = pQVar9, pQVar9 = pQVar11 + 1, pQVar9 != aend.i) {
      uVar4 = (**(code **)(*(long *)this->model + 0x138))(this->model,pQVar9);
      if ((uVar4 & 4) != 0) {
        ((abegin.i)->m).ptr = pQVar11[1].m.ptr;
        iVar3 = pQVar9->c;
        qVar2 = pQVar11[1].i;
        (abegin.i)->r = pQVar9->r;
        (abegin.i)->c = iVar3;
        (abegin.i)->i = qVar2;
        abegin.i = abegin.i + 1;
      }
    }
    QList<QModelIndex>::erase(__return_storage_ptr__,abegin,(const_iterator)aend.i);
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndexList QAbstractItemViewPrivate::selectedDraggableIndexes() const
{
    Q_Q(const QAbstractItemView);
    QModelIndexList indexes = q->selectedIndexes();
    auto isNotDragEnabled = [this](const QModelIndex &index) {
        return !isIndexDragEnabled(index);
    };
    indexes.removeIf(isNotDragEnabled);
    return indexes;
}